

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprImpliesNonNullRow(Expr *p,int iTab)

{
  int iVar1;
  long lVar2;
  ExprList_item *pEVar3;
  Walker WStack_48;
  
  if (p == (Expr *)0x0) {
    return 0;
  }
  while ((p->flags >> 0xc & 1) != 0) {
    if ((p->flags >> 0x12 & 1) == 0) {
      pEVar3 = (ExprList_item *)&p->pLeft;
    }
    else {
      pEVar3 = ((p->x).pList)->a;
    }
    p = pEVar3->pExpr;
    if (p == (Expr *)0x0) {
      return 0;
    }
  }
  do {
    lVar2 = 0x10;
    if (p->op != '3') {
      if (p->op != ',') {
        WStack_48.xExprCallback = impliesNotNullRow;
        WStack_48.eCode = 0;
        WStack_48.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        WStack_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
        WStack_48.u.n = iTab;
        walkExpr(&WStack_48,p);
        return (uint)WStack_48.eCode;
      }
      iVar1 = sqlite3ExprImpliesNonNullRow(p->pLeft,iTab);
      lVar2 = 0x18;
      if (iVar1 != 0) {
        return 1;
      }
    }
    p = *(Expr **)(&p->op + lVar2);
    if (p == (Expr *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesNonNullRow(Expr *p, int iTab){
  Walker w;
  p = sqlite3ExprSkipCollate(p);
  while( p ){
    if( p->op==TK_NOTNULL ){
      p = p->pLeft;
    }else if( p->op==TK_AND ){
      if( sqlite3ExprImpliesNonNullRow(p->pLeft, iTab) ) return 1;
      p = p->pRight;
    }else{
      break;
    }
  }
  w.xExprCallback = impliesNotNullRow;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;
  w.eCode = 0;
  w.u.iCur = iTab;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}